

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddLibraryRuntimeInfo(cmComputeLinkInformation *this,string *fullPath)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  string local_e8;
  byte local_c1;
  string local_c0;
  int local_9c;
  undefined1 local_98 [8];
  string soname;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string file;
  bool is_shared_library;
  string *fullPath_local;
  cmComputeLinkInformation *this_local;
  
  file.field_2._M_local_buf[0xf] = '\0';
  cmsys::SystemTools::GetFilenameName((string *)local_40,fullPath);
  this_00 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_61);
  bVar1 = cmMakefile::IsOn(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  if (bVar1) {
    std::__cxx11::string::string((string *)local_98);
    bVar1 = cmSystemTools::GuessLibraryInstallName(fullPath,(string *)local_98);
    if (bVar1) {
      lVar4 = std::__cxx11::string::find(local_98,0x81dee9);
      if (lVar4 == -1) {
        local_9c = 1;
      }
      else {
        local_9c = 0;
      }
    }
    else {
      local_9c = 1;
    }
    std::__cxx11::string::~string((string *)local_98);
    if (local_9c != 0) goto LAB_00361e32;
  }
  file.field_2._M_local_buf[0xf] =
       cmsys::RegularExpression::find(&this->ExtractSharedLibraryName,(string *)local_40);
  if (((!(bool)file.field_2._M_local_buf[0xf]) && ((this->ArchivesMayBeShared & 1U) != 0)) &&
     (bVar1 = cmsys::RegularExpression::find(&this->ExtractStaticLibraryName,(string *)local_40),
     bVar1)) {
    file.field_2._M_local_buf[0xf] = '\x01';
  }
  if (((file.field_2._M_local_buf[0xf] & 1U) == 0) &&
     (lVar4 = std::__cxx11::string::find((char *)fullPath,0x80690d), lVar4 != -1)) {
    if ((AddLibraryRuntimeInfo(std::__cxx11::string_const&)::splitFramework == '\0') &&
       (iVar3 = __cxa_guard_acquire(&AddLibraryRuntimeInfo(std::__cxx11::string_const&)::
                                     splitFramework), iVar3 != 0)) {
      cmsys::RegularExpression::RegularExpression
                (&AddLibraryRuntimeInfo::splitFramework,"^(.*)/(.*).framework/(.*)$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                   &AddLibraryRuntimeInfo::splitFramework,&__dso_handle);
      __cxa_guard_release(&AddLibraryRuntimeInfo(std::__cxx11::string_const&)::splitFramework);
    }
    local_c1 = 0;
    bVar2 = cmsys::RegularExpression::find(&AddLibraryRuntimeInfo::splitFramework,fullPath);
    bVar1 = false;
    if (bVar2) {
      cmsys::RegularExpression::match_abi_cxx11_(&local_c0,&AddLibraryRuntimeInfo::splitFramework,3)
      ;
      local_c1 = 1;
      cmsys::RegularExpression::match_abi_cxx11_(&local_e8,&AddLibraryRuntimeInfo::splitFramework,2)
      ;
      lVar4 = std::__cxx11::string::find((string *)&local_c0,(ulong)&local_e8);
      bVar1 = lVar4 != -1;
      std::__cxx11::string::~string((string *)&local_e8);
    }
    if ((local_c1 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_c0);
    }
    if (bVar1) {
      file.field_2._M_local_buf[0xf] = '\x01';
    }
  }
  if ((file.field_2._M_local_buf[0xf] & 1U) == 0) {
    local_9c = 1;
  }
  else {
    cmOrderDirectories::AddRuntimeLibrary(this->OrderRuntimeSearchPath,fullPath,(char *)0x0);
    if ((this->LinkWithRuntimePath & 1U) != 0) {
      cmOrderDirectories::AddRuntimeLibrary(this->OrderLinkerSearchPath,fullPath,(char *)0x0);
    }
    local_9c = 0;
  }
LAB_00361e32:
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmComputeLinkInformation::AddLibraryRuntimeInfo(
  std::string const& fullPath)
{
  // Get the name of the library from the file name.
  bool is_shared_library = false;
  std::string file = cmSystemTools::GetFilenameName(fullPath);

  if (this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    // Check that @rpath is part of the install name.
    // If it isn't, return.
    std::string soname;
    if (!cmSystemTools::GuessLibraryInstallName(fullPath, soname)) {
      return;
    }

    if (soname.find("@rpath") == std::string::npos) {
      return;
    }
  }

  is_shared_library = this->ExtractSharedLibraryName.find(file);

  if (!is_shared_library) {
    // On some platforms (AIX) a shared library may look static.
    if (this->ArchivesMayBeShared) {
      if (this->ExtractStaticLibraryName.find(file)) {
        // This is the name of a shared library or archive.
        is_shared_library = true;
      }
    }
  }

  // It could be an Apple framework
  if (!is_shared_library) {
    if (fullPath.find(".framework") != std::string::npos) {
      static cmsys::RegularExpression splitFramework(
        "^(.*)/(.*).framework/(.*)$");
      if (splitFramework.find(fullPath) &&
          (std::string::npos !=
           splitFramework.match(3).find(splitFramework.match(2)))) {
        is_shared_library = true;
      }
    }
  }

  if (!is_shared_library) {
    return;
  }

  // Include this library in the runtime path ordering.
  this->OrderRuntimeSearchPath->AddRuntimeLibrary(fullPath);
  if (this->LinkWithRuntimePath) {
    this->OrderLinkerSearchPath->AddRuntimeLibrary(fullPath);
  }
}